

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildElementC
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot fieldRegSlot,RegSlot regSlot,
          PropertyIdIndexType propertyIdIndex)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId_00;
  JITTimeFunctionBody *this_00;
  SymOpnd *src1Opnd;
  RegOpnd *pRVar3;
  undefined4 *puVar4;
  bool local_49;
  bool reuseLoc;
  RegOpnd *regOpnd;
  SymOpnd *fieldSymOpnd;
  PropertyKind propertyKind;
  Instr *pIStack_30;
  PropertyId propertyId;
  Instr *instr;
  PropertyIdIndexType propertyIdIndex_local;
  RegSlot regSlot_local;
  RegSlot fieldRegSlot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  propertyId_00 = JITTimeFunctionBody::GetReferencedPropertyId(this_00,propertyIdIndex);
  src1Opnd = BuildFieldOpnd(this,newOpcode,fieldRegSlot,propertyId_00,propertyIdIndex,
                            PropertyKindData,0xffffffff);
  local_49 = false;
  fieldRegSlot_local._2_2_ = newOpcode;
  if ((ushort)(newOpcode - DeleteFld) < 4) {
LAB_00647ae4:
    pRVar3 = BuildDstOpnd(this,regSlot,TyVar,false,local_49);
    pIStack_30 = IR::Instr::New(fieldRegSlot_local._2_2_,&pRVar3->super_Opnd,&src1Opnd->super_Opnd,
                                this->m_func);
  }
  else {
    if ((newOpcode != StFuncExpr) && (1 < (ushort)(newOpcode - InitClassMemberSet))) {
      if (newOpcode == DeleteFld_ReuseLoc) {
        fieldRegSlot_local._2_2_ = DeleteFld;
        local_49 = true;
        goto LAB_00647ae4;
      }
      if ((1 < (ushort)(newOpcode - InitSetFld)) && (newOpcode != InitProto)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xd1e,"((0))","Unknown ElementC opcode");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
        Js::Throw::FatalInternalError(-0x7fffbffb);
      }
    }
    pRVar3 = BuildSrcOpnd(this,regSlot,TyVar);
    pIStack_30 = IR::Instr::New(newOpcode,&src1Opnd->super_Opnd,&pRVar3->super_Opnd,this->m_func);
  }
  AddInstr(this,pIStack_30,offset);
  return;
}

Assistant:

void
IRBuilder::BuildElementC(Js::OpCode newOpcode, uint32 offset, Js::RegSlot fieldRegSlot, Js::RegSlot regSlot, Js::PropertyIdIndexType propertyIdIndex)
{
    IR::Instr *     instr;
    Js::PropertyId  propertyId = m_func->GetJITFunctionBody()->GetReferencedPropertyId(propertyIdIndex);
    PropertyKind    propertyKind = PropertyKindData;
    IR::SymOpnd *   fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, propertyId, propertyIdIndex, propertyKind);
    IR::RegOpnd * regOpnd;
    bool            reuseLoc = false;

    switch (newOpcode)
    {
    case Js::OpCode::DeleteFld_ReuseLoc:
        newOpcode = Js::OpCode::DeleteFld;
        reuseLoc = true;
        // fall through
    case Js::OpCode::DeleteFld:
    case Js::OpCode::DeleteRootFld:
    case Js::OpCode::DeleteFldStrict:
    case Js::OpCode::DeleteRootFldStrict:
        // Load
        regOpnd = this->BuildDstOpnd(regSlot, TyVar, false, reuseLoc);
        instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
        break;

    case Js::OpCode::InitSetFld:
    case Js::OpCode::InitGetFld:
    case Js::OpCode::InitClassMemberGet:
    case Js::OpCode::InitClassMemberSet:
    case Js::OpCode::InitProto:
    case Js::OpCode::StFuncExpr:
        // Store
        regOpnd = this->BuildSrcOpnd(regSlot);
        instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
        break;

    default:
        AssertMsg(UNREACHED, "Unknown ElementC opcode");
        Fatal();
    }

    this->AddInstr(instr, offset);
}